

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O0

void __thiscall
tchecker::parsing::process_declaration_t::~process_declaration_t(process_declaration_t *this)

{
  process_declaration_t *this_local;
  
  ~process_declaration_t(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

process_declaration_t::~process_declaration_t() = default;